

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void fmt::v11::detail::value<fmt::v11::context>::
     format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,char,void>>
               (void *arg,parse_context<char> *parse_ctx,context *ctx)

{
  ulong in_RAX;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  f;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  (parse_ctx->fmt_).data_ = (parse_ctx->fmt_).data_ + (parse_ctx->fmt_).size_;
  (parse_ctx->fmt_).size_ = 0;
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
  ::format<fmt::v11::context>
            ((formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_char,_void>
              *)((long)&uStack_8 + 7),(view *)arg,ctx);
  return;
}

Assistant:

static void format_custom(void* arg, parse_context<char_type>& parse_ctx,
                            Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_formatter<const T, char_type>(), const T, T>;
    // format must be const for compatibility with std::format and compilation.
    const auto& cf = f;
    ctx.advance_to(cf.format(*static_cast<qualified_type*>(arg), ctx));
  }